

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::DoubletonEquationPS(DoubletonEquationPS *this,DoubletonEquationPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int32_t iVar5;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b5810;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar4 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar4;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DoubletonEquationPS_003b5f28;
  iVar4 = old->m_k;
  this->m_j = old->m_j;
  this->m_k = iVar4;
  this->m_i = old->m_i;
  this->m_maxSense = old->m_maxSense;
  this->m_jFixed = old->m_jFixed;
  *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_jObj).m_backend.data._M_elems + 8);
  uVar1 = *(undefined8 *)(old->m_jObj).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_jObj).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_jObj).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->m_jObj).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->m_jObj).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 2) = uVar2;
  (this->m_jObj).m_backend.exp = (old->m_jObj).m_backend.exp;
  (this->m_jObj).m_backend.neg = (old->m_jObj).m_backend.neg;
  iVar5 = (old->m_jObj).m_backend.prec_elem;
  (this->m_jObj).m_backend.fpclass = (old->m_jObj).m_backend.fpclass;
  (this->m_jObj).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_kObj).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_kObj).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_kObj).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_kObj).m_backend.data._M_elems =
       *(undefined8 *)(old->m_kObj).m_backend.data._M_elems;
  *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_kObj).m_backend.data._M_elems + 8);
  (this->m_kObj).m_backend.exp = (old->m_kObj).m_backend.exp;
  (this->m_kObj).m_backend.neg = (old->m_kObj).m_backend.neg;
  iVar5 = (old->m_kObj).m_backend.prec_elem;
  (this->m_kObj).m_backend.fpclass = (old->m_kObj).m_backend.fpclass;
  (this->m_kObj).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_aij).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_aij).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_aij).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_aij).m_backend.data._M_elems =
       *(undefined8 *)(old->m_aij).m_backend.data._M_elems;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_aij).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_aij).m_backend.data._M_elems + 8);
  (this->m_aij).m_backend.exp = (old->m_aij).m_backend.exp;
  (this->m_aij).m_backend.neg = (old->m_aij).m_backend.neg;
  iVar5 = (old->m_aij).m_backend.prec_elem;
  (this->m_aij).m_backend.fpclass = (old->m_aij).m_backend.fpclass;
  (this->m_aij).m_backend.prec_elem = iVar5;
  this->m_strictLo = old->m_strictLo;
  this->m_strictUp = old->m_strictUp;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_newLo).m_backend.data._M_elems + 8);
  uVar1 = *(undefined8 *)(old->m_newLo).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_newLo).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_newLo).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->m_newLo).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->m_newLo).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_newLo).m_backend.data._M_elems + 2) = uVar2;
  (this->m_newLo).m_backend.exp = (old->m_newLo).m_backend.exp;
  (this->m_newLo).m_backend.neg = (old->m_newLo).m_backend.neg;
  iVar5 = (old->m_newLo).m_backend.prec_elem;
  (this->m_newLo).m_backend.fpclass = (old->m_newLo).m_backend.fpclass;
  (this->m_newLo).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_newUp).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_newUp).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_newUp).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_newUp).m_backend.data._M_elems =
       *(undefined8 *)(old->m_newUp).m_backend.data._M_elems;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_newUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_newUp).m_backend.data._M_elems + 8);
  (this->m_newUp).m_backend.exp = (old->m_newUp).m_backend.exp;
  (this->m_newUp).m_backend.neg = (old->m_newUp).m_backend.neg;
  iVar5 = (old->m_newUp).m_backend.prec_elem;
  (this->m_newUp).m_backend.fpclass = (old->m_newUp).m_backend.fpclass;
  (this->m_newUp).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_oldLo).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_oldLo).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_oldLo).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_oldLo).m_backend.data._M_elems =
       *(undefined8 *)(old->m_oldLo).m_backend.data._M_elems;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_oldLo).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_oldLo).m_backend.data._M_elems + 8);
  (this->m_oldLo).m_backend.exp = (old->m_oldLo).m_backend.exp;
  (this->m_oldLo).m_backend.neg = (old->m_oldLo).m_backend.neg;
  iVar5 = (old->m_oldLo).m_backend.prec_elem;
  (this->m_oldLo).m_backend.fpclass = (old->m_oldLo).m_backend.fpclass;
  (this->m_oldLo).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_oldUp).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_oldUp).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_oldUp).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_oldUp).m_backend.data._M_elems =
       *(undefined8 *)(old->m_oldUp).m_backend.data._M_elems;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_oldUp).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_oldUp).m_backend.data._M_elems + 8);
  (this->m_oldUp).m_backend.exp = (old->m_oldUp).m_backend.exp;
  (this->m_oldUp).m_backend.neg = (old->m_oldUp).m_backend.neg;
  iVar5 = (old->m_oldUp).m_backend.prec_elem;
  (this->m_oldUp).m_backend.fpclass = (old->m_oldUp).m_backend.fpclass;
  (this->m_oldUp).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_Lo_j).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_Lo_j).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_Lo_j).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_Lo_j).m_backend.data._M_elems =
       *(undefined8 *)(old->m_Lo_j).m_backend.data._M_elems;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_Lo_j).m_backend.data._M_elems + 8);
  (this->m_Lo_j).m_backend.exp = (old->m_Lo_j).m_backend.exp;
  (this->m_Lo_j).m_backend.neg = (old->m_Lo_j).m_backend.neg;
  iVar5 = (old->m_Lo_j).m_backend.prec_elem;
  (this->m_Lo_j).m_backend.fpclass = (old->m_Lo_j).m_backend.fpclass;
  (this->m_Lo_j).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_Up_j).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_Up_j).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_Up_j).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_Up_j).m_backend.data._M_elems =
       *(undefined8 *)(old->m_Up_j).m_backend.data._M_elems;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_Up_j).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_Up_j).m_backend.data._M_elems + 8);
  (this->m_Up_j).m_backend.exp = (old->m_Up_j).m_backend.exp;
  (this->m_Up_j).m_backend.neg = (old->m_Up_j).m_backend.neg;
  iVar5 = (old->m_Up_j).m_backend.prec_elem;
  (this->m_Up_j).m_backend.fpclass = (old->m_Up_j).m_backend.fpclass;
  (this->m_Up_j).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_lhs).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_lhs).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_lhs).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_lhs).m_backend.data._M_elems =
       *(undefined8 *)(old->m_lhs).m_backend.data._M_elems;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_lhs).m_backend.data._M_elems + 8);
  (this->m_lhs).m_backend.exp = (old->m_lhs).m_backend.exp;
  (this->m_lhs).m_backend.neg = (old->m_lhs).m_backend.neg;
  iVar5 = (old->m_lhs).m_backend.prec_elem;
  (this->m_lhs).m_backend.fpclass = (old->m_lhs).m_backend.fpclass;
  (this->m_lhs).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_rhs).m_backend.data._M_elems =
       *(undefined8 *)(old->m_rhs).m_backend.data._M_elems;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_rhs).m_backend.data._M_elems + 8);
  (this->m_rhs).m_backend.exp = (old->m_rhs).m_backend.exp;
  (this->m_rhs).m_backend.neg = (old->m_rhs).m_backend.neg;
  iVar5 = (old->m_rhs).m_backend.prec_elem;
  (this->m_rhs).m_backend.fpclass = (old->m_rhs).m_backend.fpclass;
  (this->m_rhs).m_backend.prec_elem = iVar5;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b4310;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             (old->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  return;
}

Assistant:

DoubletonEquationPS(const DoubletonEquationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_i(old.m_i)
         , m_maxSense(old.m_maxSense)
         , m_jFixed(old.m_jFixed)
         , m_jObj(old.m_jObj)
         , m_kObj(old.m_kObj)
         , m_aij(old.m_aij)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_Lo_j(old.m_Lo_j)
         , m_Up_j(old.m_Up_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_col(old.m_col)
      {}